

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfa.cc
# Opt level: O3

void __thiscall re2::DFA::AddToQueue(DFA *this,Workq *q,int id,uint32_t flag)

{
  int *piVar1;
  RE2 *pRVar2;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *pmVar3;
  bool bVar4;
  uint uVar5;
  uint i;
  int iVar6;
  ulong uVar7;
  long lVar8;
  LogMessage local_1b0;
  
  piVar1 = (this->stack_).ptr_._M_t.super___uniq_ptr_impl<int,_re2::PODArray<int>::Deleter>._M_t.
           super__Tuple_impl<0UL,_int_*,_re2::PODArray<int>::Deleter>.
           super__Head_base<0UL,_int_*,_false>._M_head_impl;
  *piVar1 = id;
  uVar7 = 1;
  do {
    if ((int)(this->stack_).ptr_._M_t.super___uniq_ptr_impl<int,_re2::PODArray<int>::Deleter>._M_t.
             super__Tuple_impl<0UL,_int_*,_re2::PODArray<int>::Deleter>.
             super__Tuple_impl<1UL,_re2::PODArray<int>::Deleter>.
             super__Head_base<1UL,_re2::PODArray<int>::Deleter,_false> < (int)uVar7) {
      __assert_fail("(nstk) <= (stack_.size())",
                    "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O3/_deps/re2-src/re2/dfa.cc"
                    ,0x340,"void re2::DFA::AddToQueue(Workq *, int, uint32_t)");
    }
    uVar7 = (ulong)((int)uVar7 - 1);
    i = piVar1[uVar7];
    while (i != 0) {
      if (i == 0xffffffff) {
        if (q->last_was_mark_ == false) {
          q->last_was_mark_ = false;
          iVar6 = q->nextmark_;
          q->nextmark_ = iVar6 + 1;
          SparseSetT<void>::InsertInternal(&q->super_SparseSet,false,iVar6);
        }
        break;
      }
      bVar4 = SparseSetT<void>::contains(&q->super_SparseSet,i);
      if (bVar4) break;
      q->last_was_mark_ = false;
      SparseSetT<void>::InsertInternal(&q->super_SparseSet,false,i);
      pRVar2 = this->prog_;
      lVar8 = (long)(int)i;
      pmVar3 = pRVar2->named_groups_;
      uVar5 = *(uint *)(pmVar3 + lVar8 * 8);
      iVar6 = (int)uVar7;
      switch(uVar5 & 7) {
      case 1:
        if ((uVar5 & 8) != 0) {
          __assert_fail("!ip->last()",
                        "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O3/_deps/re2-src/re2/dfa.cc"
                        ,0x373,"void re2::DFA::AddToQueue(Workq *, int, uint32_t)");
        }
        i = i + 1;
        uVar5 = 0;
        break;
      case 2:
      case 5:
        uVar5 = uVar5 >> 3 & 1;
        i = (uVar5 ^ 1) + i;
        break;
      case 3:
      case 6:
        if ((uVar5 & 8) == 0) {
          uVar7 = (ulong)(iVar6 + 1);
          piVar1[iVar6] = i + 1;
          uVar5 = *(uint *)(pmVar3 + lVar8 * 8);
        }
        if (((((uVar5 & 7) == 6) && (0 < q->maxmark_)) &&
            (i == *(uint *)((long)&(pRVar2->options_).max_mem_ + 4))) &&
           (i != (uint)(pRVar2->options_).max_mem_)) {
          iVar6 = (int)uVar7;
          uVar7 = (ulong)(iVar6 + 1);
          piVar1[iVar6] = -1;
          uVar5 = *(uint *)(pmVar3 + lVar8 * 8);
        }
        goto LAB_0022982b;
      case 4:
        if ((uVar5 & 8) == 0) {
          uVar7 = (ulong)(iVar6 + 1);
          piVar1[iVar6] = i + 1;
          uVar5 = *(uint *)(pmVar3 + lVar8 * 8);
        }
        if ((uVar5 & 7) != 4) {
          __assert_fail("(opcode()) == (kInstEmptyWidth)",
                        "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O3/_deps/re2-src/re2/prog.h"
                        ,0x5c,"EmptyOp re2::Prog::Inst::empty()");
        }
        if ((*(uint *)(pmVar3 + lVar8 * 8 + 4) & ~flag) != 0) goto LAB_0022985e;
LAB_0022982b:
        i = uVar5 >> 4;
        uVar5 = 0;
        break;
      default:
        LogMessage::LogMessage
                  (&local_1b0,
                   "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O3/_deps/re2-src/re2/dfa.cc"
                   ,0x359);
        std::__ostream_insert<char,std::char_traits<char>>
                  (&local_1b0.str_.super_basic_ostream<char,_std::char_traits<char>_>,
                   "unhandled opcode: ",0x12);
        std::ostream::operator<<(&local_1b0.str_,*(uint *)(pmVar3 + lVar8 * 8) & 7);
        LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1b0);
      }
      if ((char)uVar5 != '\0') break;
    }
LAB_0022985e:
    if ((int)uVar7 < 1) {
      return;
    }
  } while( true );
}

Assistant:

void DFA::AddToQueue(Workq* q, int id, uint32_t flag) {

  // Use stack_ to hold our stack of instructions yet to process.
  // It was preallocated as follows:
  //   one entry per Capture;
  //   one entry per EmptyWidth; and
  //   one entry per Nop.
  // This reflects the maximum number of stack pushes that each can
  // perform. (Each instruction can be processed at most once.)
  // When using marks, we also added nmark == prog_->size().
  // (Otherwise, nmark == 0.)
  int* stk = stack_.data();
  int nstk = 0;

  stk[nstk++] = id;
  while (nstk > 0) {
    DCHECK_LE(nstk, stack_.size());
    id = stk[--nstk];

  Loop:
    if (id == Mark) {
      q->mark();
      continue;
    }

    if (id == 0)
      continue;

    // If ip is already on the queue, nothing to do.
    // Otherwise add it.  We don't actually keep all the
    // ones that get added, but adding all of them here
    // increases the likelihood of q->contains(id),
    // reducing the amount of duplicated work.
    if (q->contains(id))
      continue;
    q->insert_new(id);

    // Process instruction.
    Prog::Inst* ip = prog_->inst(id);
    switch (ip->opcode()) {
      default:
        LOG(DFATAL) << "unhandled opcode: " << ip->opcode();
        break;

      case kInstByteRange:  // just save these on the queue
      case kInstMatch:
        if (ip->last())
          break;
        id = id+1;
        goto Loop;

      case kInstCapture:    // DFA treats captures as no-ops.
      case kInstNop:
        if (!ip->last())
          stk[nstk++] = id+1;

        // If this instruction is the [00-FF]* loop at the beginning of
        // a leftmost-longest unanchored search, separate with a Mark so
        // that future threads (which will start farther to the right in
        // the input string) are lower priority than current threads.
        if (ip->opcode() == kInstNop && q->maxmark() > 0 &&
            id == prog_->start_unanchored() && id != prog_->start())
          stk[nstk++] = Mark;
        id = ip->out();
        goto Loop;

      case kInstAltMatch:
        DCHECK(!ip->last());
        id = id+1;
        goto Loop;

      case kInstEmptyWidth:
        if (!ip->last())
          stk[nstk++] = id+1;

        // Continue on if we have all the right flag bits.
        if (ip->empty() & ~flag)
          break;
        id = ip->out();
        goto Loop;
    }
  }
}